

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void freeSection(Section *section,void *arg)

{
  void *pvVar1;
  bool bVar2;
  undefined4 local_24;
  uint32_t i;
  Section *next;
  void *arg_local;
  Section *section_local;
  
  arg_local = section;
  do {
    pvVar1 = *(void **)((long)arg_local + 0x58);
    free(*arg_local);
    bVar2 = sect_HasData(*(SectionType *)((long)arg_local + 0xc));
    if (bVar2) {
      free(*(void **)((long)arg_local + 0x28));
      for (local_24 = 0; local_24 < *(uint *)((long)arg_local + 0x30); local_24 = local_24 + 1) {
        free(*(void **)(*(long *)((long)arg_local + 0x38) + (ulong)local_24 * 0x30 + 0x20));
      }
      free(*(void **)((long)arg_local + 0x38));
    }
    free(*(void **)((long)arg_local + 0x50));
    free(arg_local);
    arg_local = pvVar1;
  } while (pvVar1 != (void *)0x0);
  return;
}

Assistant:

static void freeSection(struct Section *section, void *arg)
{
	(void)arg;

	do {
		struct Section *next = section->nextu;

		free(section->name);
		if (sect_HasData(section->type)) {
			free(section->data);
			for (uint32_t i = 0; i < section->nbPatches; i++)
				free(section->patches[i].rpnExpression);
			free(section->patches);
		}
		free(section->symbols);
		free(section);

		section = next;
	} while (section);
}